

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O0

int __thiscall HttpConn::close(HttpConn *this,int __fd)

{
  EventLoop *this_00;
  WebServer *this_01;
  int extraout_EAX;
  element_type *this_02;
  enable_shared_from_this<HttpConn> local_40 [2];
  shared_ptr<Channel> local_20;
  HttpConn *local_10;
  HttpConn *this_local;
  
  this->connStatus_ = Disconnected;
  this_00 = this->loop_;
  local_10 = this;
  std::shared_ptr<Channel>::shared_ptr(&local_20,&this->channel_);
  EventLoop::removeChannel(this_00,&local_20);
  std::shared_ptr<Channel>::~shared_ptr(&local_20);
  this_02 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &this->channel_);
  Channel::clearAll(this_02);
  ::close(this->fd_);
  reset(this);
  EventLoop::clearTimer(this->loop_,this->id_);
  EventLoop::minusConnCnt(this->loop_);
  this->linger_ = false;
  this->fd_ = -1;
  this_01 = this->server_;
  std::enable_shared_from_this<HttpConn>::shared_from_this(local_40);
  WebServer::returnConn(this_01,(HttpConnPtr *)local_40);
  std::shared_ptr<HttpConn>::~shared_ptr((shared_ptr<HttpConn> *)local_40);
  return extraout_EAX;
}

Assistant:

void HttpConn::close() {
    connStatus_ = Disconnected;
    loop_->removeChannel(channel_);
    channel_->clearAll();
    ::close(fd_); 
    reset();
    loop_->clearTimer(id_);
    loop_->minusConnCnt();
    linger_ = false;
    fd_ = -1;
    server_->returnConn(shared_from_this());
}